

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O3

int Omega_h::find_goal_symbol(Grammar *g)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int *piVar3;
  _Base_ptr p_Var4;
  int iVar5;
  bool bVar6;
  const_reference pvVar7;
  ostream *poVar8;
  int i;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  int *piVar12;
  pointer pPVar13;
  int i_00;
  int s;
  set<int,_std::less<int>,_std::allocator<int>_> nonterminals_in_rhss;
  int local_6c;
  pointer local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pPVar13 = (g->productions).
            super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (g->productions).
             super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pPVar13 != local_68) {
    do {
      piVar3 = (pPVar13->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar12 = (pPVar13->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar12 != piVar3; piVar12 = piVar12 + 1) {
        local_6c = *piVar12;
        if (local_6c < 0) {
          fail("assertion %s failed at %s +%d\n","0 <= s",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_grammar.cpp"
               ,0x1f);
        }
        bVar6 = is_terminal(g,local_6c);
        if (!bVar6) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_6c);
        }
      }
      pPVar13 = pPVar13 + 1;
    } while (pPVar13 != local_68);
  }
  i = g->nterminals;
  if (i < g->nsymbols) {
    i_00 = -1;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      p_Var11 = &p_Var1->_M_header;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002d5ef3:
        iVar5 = i;
        if (i_00 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR: there is more than one root nonterminal (",0x30);
          pvVar7 = at<std::__cxx11::string>(&g->symbol_names,i_00);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(pvVar7->_M_dataplus)._M_p,
                              pvVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," and ",5);
          pvVar7 = at<std::__cxx11::string>(&g->symbol_names,i);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pvVar7->_M_dataplus)._M_p,pvVar7->_M_string_length);
          std::operator<<(poVar8,") in this grammar\n");
          goto LAB_002d5fe1;
        }
      }
      else {
        do {
          p_Var9 = p_Var4;
          p_Var10 = p_Var11;
          _Var2 = p_Var9[1]._M_color;
          p_Var11 = p_Var9;
          if ((int)_Var2 < i) {
            p_Var11 = p_Var10;
          }
          p_Var4 = (&p_Var9->_M_left)[(int)_Var2 < i];
        } while ((&p_Var9->_M_left)[(int)_Var2 < i] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var11 == p_Var1) goto LAB_002d5ef3;
        if ((int)_Var2 < i) {
          p_Var9 = p_Var10;
        }
        iVar5 = i_00;
        if (i < (int)p_Var9[1]._M_color) goto LAB_002d5ef3;
      }
      i_00 = iVar5;
      i = i + 1;
    } while (i != g->nsymbols);
    if (i_00 != -1) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      return i_00;
    }
  }
  std::operator<<((ostream *)&std::cerr,"ERROR: the root nonterminal is unclear for this grammar\n")
  ;
LAB_002d5fe1:
  abort();
}

Assistant:

int find_goal_symbol(Grammar const& g) {
  std::set<int> nonterminals_in_rhss;
  for (auto& p : g.productions) {
    for (auto s : p.rhs) {
      OMEGA_H_CHECK(0 <= s);
      if (is_nonterminal(g, s)) nonterminals_in_rhss.insert(s);
    }
  }
  int result = -1;
  for (int s = g.nterminals; s < g.nsymbols; ++s)
    if (!nonterminals_in_rhss.count(s)) {
      if (result != -1) {
        std::cerr << "ERROR: there is more than one root nonterminal (";
        std::cerr << at(g.symbol_names, result) << " and "
                  << at(g.symbol_names, s) << ") in this grammar\n";
        abort();
      }
      result = s;
    }
  if (result == -1) {
    std::cerr << "ERROR: the root nonterminal is unclear for this grammar\n";
    abort();
  }
  return result;
}